

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::get_hash_for_pipeline_layout
          (StateRecorder *this,VkPipelineLayout layout,Hash *hash)

{
  ulong uVar1;
  bool bVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  bool bVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  long *in_FS_OFFSET;
  
  if (layout == (VkPipelineLayout)0x0) {
    *hash = 0;
    bVar5 = true;
  }
  else {
    uVar1 = (this->impl->pipeline_layout_to_hash)._M_h._M_bucket_count;
    uVar4 = (ulong)layout % uVar1;
    p_Var6 = (this->impl->pipeline_layout_to_hash)._M_h._M_buckets[uVar4];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6,
       (VkPipelineLayout)p_Var6->_M_nxt[1]._M_nxt != layout)) {
      while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar4) ||
           (p_Var7 = p_Var6, (VkPipelineLayout)p_Var3[1]._M_nxt == layout)) goto LAB_0011981b;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_0011981b:
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var7->_M_nxt;
    }
    bVar5 = p_Var3 != (_Hash_node_base *)0x0;
    if (p_Var3 == (_Hash_node_base *)0x0) {
      if ((*(int *)(*in_FS_OFFSET + -0x18) < 2) &&
         (bVar2 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "%s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
                             ,"Pipeline layout",layout), !bVar2)) {
        fprintf(_stderr,
                "Fossilize WARN: %s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
                ,"Pipeline layout",layout);
      }
    }
    else {
      *hash = (Hash)p_Var3[2]._M_nxt;
    }
  }
  return bVar5;
}

Assistant:

bool StateRecorder::get_hash_for_pipeline_layout(VkPipelineLayout layout, Hash *hash) const
{
	if (layout == VK_NULL_HANDLE)
	{
		// Allowed by VK_EXT_graphics_pipeline_library.
		*hash = 0;
		return true;
	}

	auto itr = impl->pipeline_layout_to_hash.find(layout);
	if (itr == end(impl->pipeline_layout_to_hash))
	{
		log_failed_hash("Pipeline layout", layout);
		return false;
	}
	else
	{
		*hash = itr->second;
		return true;
	}
}